

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NitfIsd.h
# Opt level: O2

void __thiscall csm::Tre::~Tre(Tre *this)

{
  std::__cxx11::string::~string((string *)(this + 0x28));
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Tre() {}